

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O1

InsertResult __thiscall
wasm::UnorderedFixedStorage<wasm::Name,_10UL>::insert
          (UnorderedFixedStorage<wasm::Name,_10UL> *this,Name *x)

{
  Name *pNVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char **ppcVar6;
  bool bVar7;
  
  uVar2 = (this->super_FixedStorageBase<wasm::Name,_10UL>).used;
  bVar7 = uVar2 != 0;
  if (bVar7) {
    pcVar3 = (x->super_IString).str._M_str;
    if ((this->super_FixedStorageBase<wasm::Name,_10UL>).storage._M_elems[0].super_IString.str.
        _M_str != pcVar3) {
      uVar5 = 0;
      ppcVar6 = &(this->super_FixedStorageBase<wasm::Name,_10UL>).storage._M_elems[1].super_IString.
                 str._M_str;
      do {
        if (uVar2 - 1 == uVar5) goto LAB_00c6521b;
        uVar5 = uVar5 + 1;
        pcVar4 = *ppcVar6;
        ppcVar6 = ppcVar6 + 2;
      } while (pcVar4 != pcVar3);
      bVar7 = uVar5 < uVar2;
    }
    if (bVar7) {
      return NoError;
    }
  }
LAB_00c6521b:
  if (uVar2 < 0xb) {
    if (uVar2 != 10) {
      (this->super_FixedStorageBase<wasm::Name,_10UL>).used = uVar2 + 1;
      pcVar3 = (x->super_IString).str._M_str;
      pNVar1 = (this->super_FixedStorageBase<wasm::Name,_10UL>).storage._M_elems + uVar2;
      (pNVar1->super_IString).str._M_len = (x->super_IString).str._M_len;
      (pNVar1->super_IString).str._M_str = pcVar3;
    }
    return (uint)(uVar2 == 10);
  }
  __assert_fail("this->used <= N",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                ,0x3e,
                "InsertResult wasm::UnorderedFixedStorage<wasm::Name, 10>::insert(const T &) [T = wasm::Name, N = 10]"
               );
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }